

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_after_free.c
# Opt level: O0

int main(void)

{
  char *__s;
  size_t sVar1;
  _Bool error;
  char *buffer;
  
  __s = (char *)malloc(0x100);
  free(__s);
  sVar1 = strlen(__s);
  printf("%lu\n",sVar1);
  return 0;
}

Assistant:

int main() {
  char* buffer = (char*)malloc (256);
  bool error = true;

  if (error)
    free(buffer);

  // [...]

  if (error)
    printf("%lu\n", strlen(buffer)); //<- Use after free
}